

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void memory_moveout_riscv64(uc_struct_conflict13 *uc,MemoryRegion_conflict *mr)

{
  MemoryRegion_conflict *pMVar1;
  undefined8 uVar2;
  undefined1 a [16];
  uint64_t uVar3;
  undefined8 in_stack_ffffffffffffffa8;
  MemoryRegion_conflict *pMVar4;
  MemoryRegion_conflict *local_28;
  MemoryRegion_conflict *mr_block;
  hwaddr addr;
  MemoryRegion_conflict *mr_local;
  uc_struct_conflict13 *uc_local;
  
  addr = (hwaddr)mr;
  mr_local = (MemoryRegion_conflict *)uc;
  memory_region_transaction_begin_riscv64();
  local_28 = *(MemoryRegion_conflict **)(addr + 0x60);
  if (local_28 == (MemoryRegion_conflict *)0x0) {
    local_28 = (MemoryRegion_conflict *)addr;
  }
  if (mr_local[2].subregions.tqh_first != (MemoryRegion *)0x0) {
    pMVar1 = mr_local[2].container;
    uVar2 = *(undefined8 *)(addr + 0x40);
    a._8_8_ = mr_local;
    a._0_8_ = in_stack_ffffffffffffffa8;
    pMVar4 = mr_local;
    uVar3 = int128_get64((Int128)a);
    (*(code *)pMVar1)(pMVar4,uVar2,uVar3);
    for (mr_block = *(MemoryRegion_conflict **)(addr + 0x40);
        0 < *(long *)(addr + 0x90) - (long)mr_block;
        mr_block = (MemoryRegion_conflict *)(&mr_block->ram + *(uint *)&mr_local[0xc].field_0x28)) {
      tlb_flush_page_riscv64((CPUState *)mr_local[2].subregions.tqh_first,(target_ulong)mr_block);
    }
  }
  memory_region_del_subregion_riscv64
            ((MemoryRegion_conflict *)mr_local[2].subregions_link.tqe_circ.tql_prev,
             (MemoryRegion_conflict *)addr);
  g_array_append_vals((GArray *)mr_local[0x5c].uc,&addr,1);
  memory_region_remove_mapped_block((uc_struct_conflict13 *)mr_local,local_28,false);
  mr_local[4].field_0x98 = 1;
  memory_region_transaction_commit_riscv64
            ((MemoryRegion_conflict *)mr_local[2].subregions_link.tqe_circ.tql_prev);
  *(long *)(addr + 0x20) = (long)(int)mr_local[0x5c].perms;
  return;
}

Assistant:

void memory_moveout(struct uc_struct *uc, MemoryRegion *mr)
{
    hwaddr addr;
    /* A bit dirty, but it works.
     * The first subregion will be the one with the smalest priority.
     * In case of CoW this will always be the region which is mapped initial and later be moved in the subregion of the container.
     * The initial subregion is the one stored in mapped_blocks
     * Because CoW is done after the snapshot level is increased there is only on subregion with 
     */
    memory_region_transaction_begin();
    MemoryRegion *mr_block = QTAILQ_FIRST(&mr->subregions);

    if (!mr_block) {
        mr_block = mr;
    }

    if (uc->cpu) {
        // We also need to remove all tb cache
        uc->uc_invalidate_tb(uc, mr->addr, int128_get64(mr->size));

        // Make sure all pages associated with the MemoryRegion are flushed
        // Only need to do this if we are in a running state
        for (addr = mr->addr; (int64_t)(mr->end - addr) > 0; addr += uc->target_page_size) {
           tlb_flush_page(uc->cpu, addr);
        }
    }

    memory_region_del_subregion(uc->system_memory, mr);
    g_array_append_val(uc->unmapped_regions, mr);
    memory_region_remove_mapped_block(uc, mr_block, false);
    uc->memory_region_update_pending = true;
    memory_region_transaction_commit(uc->system_memory);
    /* dirty hack to save the snapshot level */
    mr->container = (void *)(intptr_t)uc->snapshot_level;
}